

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl::
IncomingRpcMessageImpl(IncomingRpcMessageImpl *this,Array<capnp::word> *data)

{
  Array<capnp::word> *other;
  ReaderOptions options;
  ReaderOptions local_48 [2];
  ArrayPtr<const_capnp::word> local_28;
  Array<capnp::word> *local_18;
  Array<capnp::word> *data_local;
  IncomingRpcMessageImpl *this_local;
  
  local_18 = data;
  data_local = (Array<capnp::word> *)this;
  IncomingRpcMessage::IncomingRpcMessage(&this->super_IncomingRpcMessage);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_IncomingRpcMessage)._vptr_IncomingRpcMessage = (_func_int **)&PTR_getBody_00cc0a88;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00cc0ab0;
  other = kj::mv<kj::Array<capnp::word>>(data);
  kj::Array<capnp::word>::Array(&this->data,other);
  local_28 = kj::Array::operator_cast_to_ArrayPtr((Array *)&this->data);
  local_48[0].traversalLimitInWords = 0;
  local_48[0].nestingLimit = 0;
  local_48[0]._12_4_ = 0;
  ReaderOptions::ReaderOptions(local_48);
  options.nestingLimit = local_48[0].nestingLimit;
  options.traversalLimitInWords = local_48[0].traversalLimitInWords;
  options._12_4_ = 0;
  FlatArrayMessageReader::FlatArrayMessageReader(&this->message,local_28,options);
  return;
}

Assistant:

IncomingRpcMessageImpl(kj::Array<word> data)
          : data(kj::mv(data)),
            message(this->data) {}